

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetRenderStyle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  uint uVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  ulong uVar5;
  undefined8 *puVar6;
  char *pcVar7;
  bool bVar8;
  double dVar9;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003d4b30;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d4b20:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d4b30:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xcc4,
                  "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  puVar6 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar6 == (undefined8 *)0x0) goto LAB_003d4a96;
    pPVar4 = (PClass *)puVar6[1];
    if (pPVar4 == (PClass *)0x0) {
      pPVar4 = (PClass *)(**(code **)*puVar6)(puVar6);
      puVar6[1] = pPVar4;
    }
    bVar8 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar3 && bVar8) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar3) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d4b30;
    }
  }
  else {
    if (puVar6 != (undefined8 *)0x0) goto LAB_003d4b20;
LAB_003d4a96:
    puVar6 = (undefined8 *)0x0;
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      dVar1 = param[1].field_0.f;
      if (numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003d4ad8;
        pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003d4ad8:
          uVar2 = param[2].field_0.i;
          dVar9 = 1.0;
          if (dVar1 <= 1.0) {
            dVar9 = dVar1;
          }
          puVar6[0x23] = -(ulong)(0.0 < dVar1) & (ulong)dVar9;
          uVar5 = (ulong)uVar2;
          if (0xd < uVar2) {
            uVar5 = 0;
          }
          *(FRenderStyle *)(puVar6 + 0x21) = LegacyRenderStyles[uVar5];
          return 0;
        }
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xcc6,
                    "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar7 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xcc5,
                "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetRenderStyle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(alpha);
	PARAM_INT_DEF(mode);

	self->Alpha = clamp(alpha, 0., 1.);
	self->RenderStyle = ERenderStyle(mode);
	return 0;
}